

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_warning.c
# Opt level: O1

void TIFFWarning(char *module,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (_TIFFwarningHandler != (TIFFErrorHandler)0x0) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    (*_TIFFwarningHandler)(module,fmt,&local_e8);
  }
  if (_TIFFwarningHandlerExt != (TIFFErrorHandlerExt)0x0) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    (*_TIFFwarningHandlerExt)((thandle_t)0x0,module,fmt,&local_e8);
  }
  return;
}

Assistant:

void TIFFWarning(const char *module, const char *fmt, ...)
{
    va_list ap;
    if (_TIFFwarningHandler)
    {
        va_start(ap, fmt);
        (*_TIFFwarningHandler)(module, fmt, ap);
        va_end(ap);
    }
    if (_TIFFwarningHandlerExt)
    {
        va_start(ap, fmt);
        (*_TIFFwarningHandlerExt)(0, module, fmt, ap);
        va_end(ap);
    }
}